

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

long calculator::toBase<long,16ul>(string *s)

{
  ostream *poVar1;
  long local_1b0;
  long v;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  string *local_10;
  string *s_local;
  
  local_10 = s;
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = (ostream *)std::ostream::operator<<(local_188,std::hex);
  std::operator<<(poVar1,(string *)local_10);
  std::istream::operator>>((istream *)local_198,&local_1b0);
  std::__cxx11::stringstream::~stringstream(local_198);
  return local_1b0;
}

Assistant:

inline T toBase(const std::string& s) {
    std::stringstream ss;
    if (Base == 16)
        ss << std::hex << s;
    else if (Base == 8)
        ss << std::oct << s;
    else if (Base == 2)
        return std::bitset<32>(s).to_ulong();
    T v;
    ss >> v;
    return v;
}